

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall
btDbvtBroadphase::getBroadphaseAabb(btDbvtBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btScalar *pbVar1;
  bool bVar2;
  btVector3 *pbVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  btDbvtAabbMm *in_RDI;
  btDbvtVolume bounds;
  btScalar local_74;
  btScalar in_stack_ffffffffffffff90;
  btScalar in_stack_ffffffffffffff94;
  btScalar in_stack_ffffffffffffff98;
  btScalar in_stack_ffffffffffffff9c;
  btDbvtAabbMm *in_stack_ffffffffffffffa0;
  btScalar local_58 [2];
  btScalar local_50 [2];
  btScalar local_48 [2];
  btScalar local_40 [2];
  btDbvtAabbMm local_38;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  btDbvtAabbMm::btDbvtAabbMm(in_RDI);
  bVar2 = btDbvt::empty((btDbvt *)((in_RDI->mi).m_floats + 2));
  if (bVar2) {
    bVar2 = btDbvt::empty((btDbvt *)(in_RDI[3].mi.m_floats + 2));
    if (bVar2) {
      local_74 = 0.0;
      btVector3::btVector3
                ((btVector3 *)&stack0xffffffffffffff98,(btScalar *)&stack0xffffffffffffff94,
                 (btScalar *)&stack0xffffffffffffff90,&local_74);
      btDbvtAabbMm::FromCR(&in_stack_ffffffffffffffa0->mi,in_stack_ffffffffffffff9c);
      local_38.mi.m_floats._0_8_ = local_58;
      local_38.mi.m_floats._8_8_ = local_50;
      local_38.mx.m_floats._0_8_ = local_48;
      local_38.mx.m_floats._8_8_ = local_40;
    }
    else {
      pbVar1 = *(btScalar **)(in_RDI[3].mi.m_floats + 2);
      local_38.mi.m_floats._0_8_ = *(undefined8 *)pbVar1;
      local_38.mi.m_floats._8_8_ = *(undefined8 *)(pbVar1 + 2);
      local_38.mx.m_floats._0_8_ = *(undefined8 *)(pbVar1 + 4);
      local_38.mx.m_floats._8_8_ = *(undefined8 *)(pbVar1 + 6);
    }
  }
  else {
    bVar2 = btDbvt::empty((btDbvt *)(in_RDI[3].mi.m_floats + 2));
    if (bVar2) {
      pbVar1 = *(btScalar **)((in_RDI->mi).m_floats + 2);
      local_38.mi.m_floats._0_8_ = *(undefined8 *)pbVar1;
      local_38.mi.m_floats._8_8_ = *(undefined8 *)(pbVar1 + 2);
      local_38.mx.m_floats._0_8_ = *(undefined8 *)(pbVar1 + 4);
      local_38.mx.m_floats._8_8_ = *(undefined8 *)(pbVar1 + 6);
    }
    else {
      Merge(in_stack_ffffffffffffffa0,
            (btDbvtAabbMm *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
            (btDbvtAabbMm *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
  }
  pbVar3 = btDbvtAabbMm::Mins(&local_38);
  *local_10 = *(undefined8 *)pbVar3->m_floats;
  local_10[1] = *(undefined8 *)(pbVar3->m_floats + 2);
  pbVar3 = btDbvtAabbMm::Maxs(&local_38);
  *local_18 = *(undefined8 *)pbVar3->m_floats;
  local_18[1] = *(undefined8 *)(pbVar3->m_floats + 2);
  return;
}

Assistant:

void							btDbvtBroadphase::getBroadphaseAabb(btVector3& aabbMin,btVector3& aabbMax) const
{

	ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds;

	if(!m_sets[0].empty())
		if(!m_sets[1].empty())	Merge(	m_sets[0].m_root->volume,
			m_sets[1].m_root->volume,bounds);
		else
			bounds=m_sets[0].m_root->volume;
	else if(!m_sets[1].empty())	bounds=m_sets[1].m_root->volume;
	else
		bounds=btDbvtVolume::FromCR(btVector3(0,0,0),0);
	aabbMin=bounds.Mins();
	aabbMax=bounds.Maxs();
}